

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::cord_internal::CordRepBtree::AddCordRep<(absl::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *tree,CordRep *rep)

{
  bool owned;
  int depth_00;
  CordRepBtree *pCVar1;
  OpResult result_00;
  OpResult OVar2;
  OpResult result;
  CordRepBtree *leaf;
  StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0> ops;
  size_t length;
  int depth;
  CordRep *rep_local;
  CordRepBtree *tree_local;
  
  depth_00 = height(tree);
  ops.stack[0xb] = (CordRepBtree *)rep->length;
  pCVar1 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0>::
           BuildStack((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0> *)&leaf,tree,
                      depth_00);
  owned = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0>::owned
                    ((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0> *)&leaf,
                     depth_00);
  OVar2 = AddEdge<(absl::cord_internal::CordRepBtree::EdgeType)0>
                    (pCVar1,owned,rep,(size_t)ops.stack[0xb]);
  result_00._12_4_ = 0;
  result_00.tree = (CordRepBtree *)SUB128(OVar2._0_12_,0);
  result_00.action = SUB124(OVar2._0_12_,8);
  pCVar1 = anon_unknown_0::StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0>::
           Unwind<false>((StackOperations<(absl::cord_internal::CordRepBtree::EdgeType)0> *)&leaf,
                         tree,depth_00,(size_t)ops.stack[0xb],result_00);
  return pCVar1;
}

Assistant:

CordRepBtree* CordRepBtree::AddCordRep(CordRepBtree* tree, CordRep* rep) {
  const int depth = tree->height();
  const size_t length = rep->length;
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);
  const OpResult result =
      leaf->AddEdge<edge_type>(ops.owned(depth), rep, length);
  return ops.Unwind(tree, depth, length, result);
}